

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void aom_hadamard_16x16_avx2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  int in_stack_00000304;
  tran_low_t *in_stack_00000308;
  ptrdiff_t in_stack_00000310;
  int16_t *in_stack_00000318;
  
  hadamard_16x16_avx2(in_stack_00000318,in_stack_00000310,in_stack_00000308,in_stack_00000304);
  return;
}

Assistant:

void aom_hadamard_16x16_avx2(const int16_t *src_diff, ptrdiff_t src_stride,
                             tran_low_t *coeff) {
  hadamard_16x16_avx2(src_diff, src_stride, coeff, 1);
}